

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int mt_flush_queue(BGZF *fp)

{
  int *piVar1;
  bgzf_mtaux_t *pbVar2;
  ulong uVar3;
  long lVar4;
  ssize_t sVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  pbVar2 = fp->mt;
  pthread_mutex_lock((pthread_mutex_t *)&pbVar2->lock);
  uVar6 = 0;
  uVar3 = (ulong)(uint)pbVar2->n_threads;
  if (pbVar2->n_threads < 1) {
    uVar3 = uVar6;
  }
  for (; uVar3 * 0x20 != uVar6; uVar6 = uVar6 + 0x20) {
    *(undefined4 *)((long)&pbVar2->w->toproc + uVar6) = 1;
  }
  pbVar2->proc_cnt = 0;
  pthread_cond_broadcast((pthread_cond_t *)&pbVar2->cv);
  pthread_mutex_unlock((pthread_mutex_t *)&pbVar2->lock);
  worker_aux(pbVar2->w);
  iVar8 = pbVar2->n_threads;
  do {
  } while (pbVar2->proc_cnt < iVar8);
  lVar4 = 0x14;
  for (lVar7 = 0; lVar7 < iVar8; lVar7 = lVar7 + 1) {
    *(uint *)fp = *(uint *)fp | (uint)*(ushort *)((long)&pbVar2->w->mt + lVar4);
    iVar8 = pbVar2->n_threads;
    lVar4 = lVar4 + 0x20;
  }
  lVar4 = 0;
  do {
    if (pbVar2->curr <= lVar4) goto LAB_0012cee4;
    sVar5 = hwrite(fp->fp,pbVar2->blk[lVar4],(long)pbVar2->len[lVar4]);
    piVar1 = pbVar2->len + lVar4;
    lVar4 = lVar4 + 1;
  } while (sVar5 == *piVar1);
  *(byte *)fp = *(byte *)fp | 4;
LAB_0012cee4:
  pbVar2->curr = 0;
  return -(uint)(*(short *)fp != 0);
}

Assistant:

static int mt_flush_queue(BGZF *fp)
{
    int i;
    mtaux_t *mt = fp->mt;
    // signal all the workers to compress
    pthread_mutex_lock(&mt->lock);
    for (i = 0; i < mt->n_threads; ++i) mt->w[i].toproc = 1;
    mt->proc_cnt = 0;
    pthread_cond_broadcast(&mt->cv);
    pthread_mutex_unlock(&mt->lock);
    // worker 0 is doing things here
    worker_aux(&mt->w[0]);
    // wait for all the threads to complete
    while (mt->proc_cnt < mt->n_threads);
    // dump data to disk
    for (i = 0; i < mt->n_threads; ++i) fp->errcode |= mt->w[i].errcode;
    for (i = 0; i < mt->curr; ++i)
        if (hwrite(fp->fp, mt->blk[i], mt->len[i]) != mt->len[i]) {
            fp->errcode |= BGZF_ERR_IO;
            break;
        }
    mt->curr = 0;
    return (fp->errcode == 0)? 0 : -1;
}